

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphereTriangleDetector.cpp
# Opt level: O1

bool __thiscall
SphereTriangleDetector::collide
          (SphereTriangleDetector *this,btVector3 *sphereCenter,btVector3 *point,
          btVector3 *resultNormal,btScalar *depth,btScalar *timeOfImpact,
          btScalar contactBreakingThreshold)

{
  undefined8 uVar1;
  undefined8 uVar2;
  btTriangleShape *pbVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  SphereTriangleDetector *pSVar7;
  uint uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  btScalar bVar16;
  btScalar bVar17;
  float fVar18;
  btVector3 lp;
  btVector3 pa;
  btVector3 pb;
  float local_f8;
  float fStack_f4;
  float local_c8;
  btScalar bStack_c4;
  btVector3 local_88;
  btVector3 *local_70;
  undefined1 local_68 [16];
  btVector3 local_50;
  btVector3 local_40;
  
  pbVar3 = this->m_triangle;
  bVar16 = (this->m_sphere->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[0] *
           *(float *)&(this->m_sphere->super_btConvexInternalShape).super_btConvexShape.
                      super_btCollisionShape.field_0x1c;
  fVar14 = pbVar3->m_vertices1[0].m_floats[0];
  fVar12 = pbVar3->m_vertices1[1].m_floats[0] - fVar14;
  uVar1 = *(undefined8 *)(pbVar3->m_vertices1[1].m_floats + 1);
  uVar2 = *(undefined8 *)(pbVar3->m_vertices1[0].m_floats + 1);
  fVar18 = (float)uVar2;
  fVar13 = (float)((ulong)uVar2 >> 0x20);
  fVar10 = (float)uVar1 - fVar18;
  fVar11 = (float)((ulong)uVar1 >> 0x20) - fVar13;
  fVar18 = pbVar3->m_vertices1[2].m_floats[1] - fVar18;
  fVar13 = pbVar3->m_vertices1[2].m_floats[2] - fVar13;
  fVar14 = pbVar3->m_vertices1[2].m_floats[0] - fVar14;
  fVar15 = fVar10 * fVar13 - fVar18 * fVar11;
  fVar11 = fVar11 * fVar14 - fVar13 * fVar12;
  fVar10 = fVar18 * fVar12 - fVar14 * fVar10;
  fVar14 = fVar10 * fVar10 + fVar15 * fVar15 + fVar11 * fVar11;
  pSVar7 = this;
  if (fVar14 < 0.0) {
    fVar14 = sqrtf(fVar14);
  }
  else {
    fVar14 = SQRT(fVar14);
  }
  bVar17 = 0.0;
  fVar12 = contactBreakingThreshold + bVar16;
  fVar14 = 1.0 / fVar14;
  fVar10 = fVar10 * fVar14;
  fVar15 = fVar14 * fVar15;
  fVar14 = fVar14 * fVar11;
  uVar1 = *(undefined8 *)sphereCenter->m_floats;
  fVar11 = sphereCenter->m_floats[2];
  bStack_c4 = 0.0;
  local_c8 = (fVar11 - pbVar3->m_vertices1[0].m_floats[2]) * fVar10 +
             ((float)uVar1 - pbVar3->m_vertices1[0].m_floats[0]) * fVar15 +
             (SUB84(uVar1,4) - pbVar3->m_vertices1[0].m_floats[1]) * fVar14;
  if (local_c8 < 0.0) {
    bStack_c4 = -0.0;
    local_c8 = -local_c8;
    fVar15 = -fVar15;
    fVar14 = -fVar14;
    fVar10 = -fVar10;
  }
  if (local_c8 < fVar12) {
    local_88.m_floats._0_8_ = *(undefined8 *)sphereCenter->m_floats;
    local_88.m_floats._8_8_ = *(undefined8 *)(sphereCenter->m_floats + 2);
    local_68._4_4_ = fVar14;
    local_68._0_4_ = fVar15;
    local_68._8_4_ = fVar10;
    local_68._12_4_ = 0;
    local_50.m_floats[1] = fVar14;
    local_50.m_floats[0] = fVar15;
    local_50.m_floats[2] = fVar10;
    local_50.m_floats[3] = 0.0;
    local_f8 = fVar15;
    fStack_f4 = fVar14;
    fVar13 = bVar16;
    bVar4 = pointInTriangle(pSVar7,pbVar3->m_vertices1,&local_50,&local_88);
    if (bVar4) {
      local_f8 = (float)uVar1 - local_c8 * fVar15;
      fStack_f4 = SUB84(uVar1,4) - local_c8 * fVar14;
      fVar13 = fVar11 - fVar10 * local_c8;
      bVar17 = 0.0;
    }
    else {
      iVar5 = (*(this->m_triangle->super_btPolyhedralConvexShape).super_btConvexInternalShape.
                super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape[0x19])();
      uVar9 = 0;
      if (0 < iVar5) {
        uVar6 = 0;
        _local_f8 = uVar1;
        local_70 = resultNormal;
        do {
          (*(this->m_triangle->super_btPolyhedralConvexShape).super_btConvexInternalShape.
            super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape[0x1a])
                    (this->m_triangle,uVar9,&local_50,&local_40);
          bVar17 = SegmentSqrDistance(&local_50,&local_40,sphereCenter,&local_88);
          if (bVar17 < fVar12 * fVar12) {
            uVar6 = 1;
            _local_c8 = local_88.m_floats._8_8_;
            _local_f8 = local_88.m_floats._0_8_;
          }
          uVar8 = (int)uVar9 + 1;
          uVar9 = (ulong)uVar8;
          iVar5 = (*(this->m_triangle->super_btPolyhedralConvexShape).super_btConvexInternalShape.
                    super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape[0x19])();
        } while ((int)uVar8 < iVar5);
        uVar9 = (ulong)uVar6;
        resultNormal = local_70;
        fVar13 = local_c8;
        bVar17 = bStack_c4;
      }
      if (uVar9 == 0) {
        return false;
      }
    }
    fVar11 = (float)*(undefined8 *)sphereCenter->m_floats - local_f8;
    fVar18 = (float)((ulong)*(undefined8 *)sphereCenter->m_floats >> 0x20) - fStack_f4;
    fVar10 = sphereCenter->m_floats[2] - fVar13;
    fVar14 = fVar10 * fVar10 + fVar11 * fVar11 + fVar18 * fVar18;
    if (fVar14 < fVar12 * fVar12) {
      if (fVar14 <= 1.1920929e-07) {
        *(undefined8 *)resultNormal->m_floats = local_68._0_8_;
        *(undefined8 *)(resultNormal->m_floats + 2) = local_68._8_8_;
        point->m_floats[0] = local_f8;
        point->m_floats[1] = fStack_f4;
        point->m_floats[2] = fVar13;
        point->m_floats[3] = bVar17;
      }
      else {
        if (fVar14 < 0.0) {
          fVar14 = sqrtf(fVar14);
        }
        else {
          fVar14 = SQRT(fVar14);
        }
        resultNormal->m_floats[0] = fVar11;
        resultNormal->m_floats[1] = fVar18;
        resultNormal->m_floats[2] = fVar10;
        resultNormal->m_floats[3] = 0.0;
        fVar10 = resultNormal->m_floats[2] * resultNormal->m_floats[2] +
                 resultNormal->m_floats[0] * resultNormal->m_floats[0] +
                 resultNormal->m_floats[1] * resultNormal->m_floats[1];
        if (fVar10 < 0.0) {
          fVar10 = sqrtf(fVar10);
        }
        else {
          fVar10 = SQRT(fVar10);
        }
        fVar10 = 1.0 / fVar10;
        *(ulong *)resultNormal->m_floats =
             CONCAT44(fVar10 * (float)((ulong)*(undefined8 *)resultNormal->m_floats >> 0x20),
                      fVar10 * (float)*(undefined8 *)resultNormal->m_floats);
        resultNormal->m_floats[2] = fVar10 * resultNormal->m_floats[2];
        point->m_floats[0] = local_f8;
        point->m_floats[1] = fStack_f4;
        point->m_floats[2] = fVar13;
        point->m_floats[3] = bVar17;
        bVar16 = bVar16 - fVar14;
      }
      *depth = -bVar16;
      return true;
    }
  }
  return false;
}

Assistant:

bool SphereTriangleDetector::collide(const btVector3& sphereCenter,btVector3 &point, btVector3& resultNormal, btScalar& depth, btScalar &timeOfImpact, btScalar contactBreakingThreshold)
{

	const btVector3* vertices = &m_triangle->getVertexPtr(0);
	
	btScalar radius = m_sphere->getRadius();
	btScalar radiusWithThreshold = radius + contactBreakingThreshold;

	btVector3 normal = (vertices[1]-vertices[0]).cross(vertices[2]-vertices[0]);
	normal.normalize();
	btVector3 p1ToCentre = sphereCenter - vertices[0];
	btScalar distanceFromPlane = p1ToCentre.dot(normal);

	if (distanceFromPlane < btScalar(0.))
	{
		//triangle facing the other way
		distanceFromPlane *= btScalar(-1.);
		normal *= btScalar(-1.);
	}

	bool isInsideContactPlane = distanceFromPlane < radiusWithThreshold;
	
	// Check for contact / intersection
	bool hasContact = false;
	btVector3 contactPoint;
	if (isInsideContactPlane) {
		if (facecontains(sphereCenter,vertices,normal)) {
			// Inside the contact wedge - touches a point on the shell plane
			hasContact = true;
			contactPoint = sphereCenter - normal*distanceFromPlane;
		} else {
			// Could be inside one of the contact capsules
			btScalar contactCapsuleRadiusSqr = radiusWithThreshold*radiusWithThreshold;
			btVector3 nearestOnEdge;
			for (int i = 0; i < m_triangle->getNumEdges(); i++) {
				
				btVector3 pa;
				btVector3 pb;
				
				m_triangle->getEdge(i,pa,pb);

				btScalar distanceSqr = SegmentSqrDistance(pa,pb,sphereCenter, nearestOnEdge);
				if (distanceSqr < contactCapsuleRadiusSqr) {
					// Yep, we're inside a capsule
					hasContact = true;
					contactPoint = nearestOnEdge;
				}
				
			}
		}
	}

	if (hasContact) {
		btVector3 contactToCentre = sphereCenter - contactPoint;
		btScalar distanceSqr = contactToCentre.length2();

		if (distanceSqr < radiusWithThreshold*radiusWithThreshold)
		{
			if (distanceSqr>SIMD_EPSILON)
			{
				btScalar distance = btSqrt(distanceSqr);
				resultNormal = contactToCentre;
				resultNormal.normalize();
				point = contactPoint;
				depth = -(radius-distance);
			} else
			{
				resultNormal = normal;
				point = contactPoint;
				depth = -radius;
			}
			return true;
		}
	}
	
	return false;
}